

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_vmask_sse4.c
# Opt level: O1

void blend_a64_vmask_b12_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,int w,int h)

{
  uint16_t *puVar1;
  long lVar2;
  undefined1 in_XMM0 [16];
  undefined1 auVar3 [16];
  undefined4 uVar4;
  short sVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint16_t uVar14;
  uint16_t uVar21;
  uint16_t uVar22;
  uint16_t uVar23;
  uint16_t uVar24;
  uint16_t uVar25;
  uint16_t uVar26;
  undefined1 auVar15 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint16_t uVar27;
  undefined1 auVar5 [12];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  auVar3 = pmovsxbw(in_XMM0,0x4040404040404040);
  do {
    if (0 < w) {
      auVar6 = pshuflw(ZEXT116(*mask),ZEXT116(*mask),0);
      uVar4 = auVar6._0_4_;
      auVar5._0_8_ = CONCAT44(uVar4,uVar4);
      auVar5._8_4_ = uVar4;
      sVar7 = auVar6._2_2_;
      auVar10._12_2_ = sVar7;
      auVar10._0_12_ = auVar5;
      auVar10._14_2_ = auVar3._6_2_ - sVar7;
      auVar9._12_4_ = auVar10._12_4_;
      auVar9._0_10_ = auVar5._0_10_;
      auVar9._10_2_ = auVar3._4_2_ - auVar6._0_2_;
      auVar19._10_6_ = auVar9._10_6_;
      auVar19._8_2_ = auVar6._0_2_;
      auVar19._0_8_ = auVar5._0_8_;
      auVar12._8_8_ = auVar19._8_8_;
      auVar12._6_2_ = auVar3._2_2_ - sVar7;
      auVar12._4_2_ = sVar7;
      auVar12._0_4_ = uVar4;
      auVar8._4_12_ = auVar12._4_12_;
      auVar8._2_2_ = auVar3._0_2_ - auVar6._0_2_;
      auVar8._0_2_ = auVar6._0_2_;
      auVar6._2_2_ = auVar3._8_2_ - auVar6._0_2_;
      auVar6._4_2_ = sVar7;
      auVar6._6_2_ = auVar3._10_2_ - sVar7;
      auVar6._8_2_ = auVar6._0_2_;
      auVar6._10_2_ = auVar3._12_2_ - auVar6._0_2_;
      auVar6._12_2_ = sVar7;
      auVar6._14_2_ = auVar3._14_2_ - sVar7;
      lVar2 = 0;
      do {
        auVar12 = *(undefined1 (*) [16])(src0 + lVar2);
        puVar1 = src1 + lVar2;
        auVar18._0_12_ = auVar12._0_12_;
        auVar18._12_2_ = auVar12._6_2_;
        auVar18._14_2_ = puVar1[3];
        auVar17._12_4_ = auVar18._12_4_;
        auVar17._0_10_ = auVar12._0_10_;
        auVar17._10_2_ = puVar1[2];
        auVar16._10_6_ = auVar17._10_6_;
        auVar16._0_8_ = auVar12._0_8_;
        auVar16._8_2_ = auVar12._4_2_;
        auVar15._8_8_ = auVar16._8_8_;
        auVar15._6_2_ = puVar1[1];
        auVar15._4_2_ = auVar12._2_2_;
        auVar15._0_2_ = auVar12._0_2_;
        auVar15._2_2_ = *puVar1;
        auVar19 = pmaddwd(auVar15,auVar8);
        auVar11._2_2_ = puVar1[4];
        auVar11._0_2_ = auVar12._8_2_;
        auVar11._4_2_ = auVar12._10_2_;
        auVar11._6_2_ = puVar1[5];
        auVar11._8_2_ = auVar12._12_2_;
        auVar11._10_2_ = puVar1[6];
        auVar11._12_2_ = auVar12._14_2_;
        auVar11._14_2_ = puVar1[7];
        auVar12 = pmaddwd(auVar11,auVar6);
        auVar20._0_4_ = auVar19._0_4_ >> 5;
        auVar20._4_4_ = auVar19._4_4_ >> 5;
        auVar20._8_4_ = auVar19._8_4_ >> 5;
        auVar20._12_4_ = auVar19._12_4_ >> 5;
        auVar13._0_4_ = auVar12._0_4_ >> 5;
        auVar13._4_4_ = auVar12._4_4_ >> 5;
        auVar13._8_4_ = auVar12._8_4_ >> 5;
        auVar13._12_4_ = auVar12._12_4_ >> 5;
        auVar12 = packssdw(auVar20,auVar13);
        uVar14 = pavgw(auVar12._0_2_,0);
        uVar21 = pavgw(auVar12._2_2_,0);
        uVar22 = pavgw(auVar12._4_2_,0);
        uVar23 = pavgw(auVar12._6_2_,0);
        uVar24 = pavgw(auVar12._8_2_,0);
        uVar25 = pavgw(auVar12._10_2_,0);
        uVar26 = pavgw(auVar12._12_2_,0);
        uVar27 = pavgw(auVar12._14_2_,0);
        puVar1 = dst + lVar2;
        *puVar1 = uVar14;
        puVar1[1] = uVar21;
        puVar1[2] = uVar22;
        puVar1[3] = uVar23;
        puVar1[4] = uVar24;
        puVar1[5] = uVar25;
        puVar1[6] = uVar26;
        puVar1[7] = uVar27;
        lVar2 = lVar2 + 8;
      } while ((int)lVar2 < w);
    }
    mask = mask + 1;
    dst = dst + dst_stride;
    src1 = src1 + src1_stride;
    src0 = src0 + src0_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_vmask_b12_w8n_sse4_1(uint16_t *dst, uint32_t dst_stride,
                                           const uint16_t *src0,
                                           uint32_t src0_stride,
                                           const uint16_t *src1,
                                           uint32_t src1_stride,
                                           const uint8_t *mask, int w, int h) {
  blend_a64_vmask_bn_w8n_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                                src1_stride, mask, w, h, blend_8_b12);
}